

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggwave.cpp
# Opt level: O1

void __thiscall GGWave::Protocols::disableAll(Protocols *this)

{
  undefined1 auVar1 [16];
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int iVar8;
  int iVar14;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  long lVar4;
  
  auVar1 = _DAT_0010c0c0;
  lVar2 = 0x7d;
  auVar3 = _DAT_0010c100;
  auVar5 = _DAT_0010c110;
  auVar6 = _DAT_0010c120;
  auVar7 = _DAT_0010c0d0;
  do {
    auVar9 = auVar7 ^ auVar1;
    iVar8 = auVar9._0_4_;
    iVar14 = auVar9._8_4_;
    auVar15._4_4_ = iVar8;
    auVar15._0_4_ = iVar8;
    auVar15._8_4_ = iVar14;
    auVar15._12_4_ = iVar14;
    auVar19._0_4_ = -(uint)(iVar8 < -0x7fffffea);
    auVar19._4_4_ = -(uint)(iVar8 < -0x7fffffea);
    auVar19._8_4_ = -(uint)(iVar14 < -0x7fffffea);
    auVar19._12_4_ = -(uint)(iVar14 < -0x7fffffea);
    auVar10._0_4_ = -(uint)(auVar9._4_4_ == -0x80000000);
    auVar10._4_4_ = -(uint)(auVar9._4_4_ == -0x80000000);
    auVar10._8_4_ = -(uint)(auVar9._12_4_ == -0x80000000);
    auVar10._12_4_ = -(uint)(auVar9._12_4_ == -0x80000000);
    auVar10 = auVar10 & auVar19;
    auVar9 = pshuflw(auVar15,auVar10,0xe8);
    auVar9 = packssdw(auVar9,auVar9);
    if ((auVar9 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      *(undefined1 *)((long)(this->data + -7) + lVar2) = 0;
    }
    auVar9 = packssdw(auVar10,auVar10);
    auVar9 = packssdw(auVar9,auVar9);
    if ((auVar9._0_4_ >> 0x10 & 1) != 0) {
      *(undefined1 *)((long)(this->data + -6) + lVar2) = 0;
    }
    auVar9 = auVar6 ^ auVar1;
    iVar8 = auVar9._0_4_;
    iVar14 = auVar9._8_4_;
    auVar16._4_4_ = iVar8;
    auVar16._0_4_ = iVar8;
    auVar16._8_4_ = iVar14;
    auVar16._12_4_ = iVar14;
    auVar20._0_4_ = -(uint)(iVar8 < -0x7fffffea);
    auVar20._4_4_ = -(uint)(iVar8 < -0x7fffffea);
    auVar20._8_4_ = -(uint)(iVar14 < -0x7fffffea);
    auVar20._12_4_ = -(uint)(iVar14 < -0x7fffffea);
    auVar11._0_4_ = -(uint)(auVar9._4_4_ == -0x80000000);
    auVar11._4_4_ = -(uint)(auVar9._4_4_ == -0x80000000);
    auVar11._8_4_ = -(uint)(auVar9._12_4_ == -0x80000000);
    auVar11._12_4_ = -(uint)(auVar9._12_4_ == -0x80000000);
    auVar11 = auVar11 & auVar20;
    auVar9 = packssdw(auVar16,auVar11);
    auVar9 = packssdw(auVar9,auVar9);
    if ((auVar9 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      *(undefined1 *)((long)(this->data + -5) + lVar2) = 0;
    }
    auVar9 = pshufhw(auVar11,auVar11,0x84);
    auVar9 = packssdw(auVar9,auVar9);
    if ((auVar9 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      *(undefined1 *)((long)(this->data + -4) + lVar2) = 0;
    }
    auVar9 = auVar5 ^ auVar1;
    iVar8 = auVar9._0_4_;
    iVar14 = auVar9._8_4_;
    auVar17._4_4_ = iVar8;
    auVar17._0_4_ = iVar8;
    auVar17._8_4_ = iVar14;
    auVar17._12_4_ = iVar14;
    auVar21._0_4_ = -(uint)(iVar8 < -0x7fffffea);
    auVar21._4_4_ = -(uint)(iVar8 < -0x7fffffea);
    auVar21._8_4_ = -(uint)(iVar14 < -0x7fffffea);
    auVar21._12_4_ = -(uint)(iVar14 < -0x7fffffea);
    auVar12._0_4_ = -(uint)(auVar9._4_4_ == -0x80000000);
    auVar12._4_4_ = -(uint)(auVar9._4_4_ == -0x80000000);
    auVar12._8_4_ = -(uint)(auVar9._12_4_ == -0x80000000);
    auVar12._12_4_ = -(uint)(auVar9._12_4_ == -0x80000000);
    auVar12 = auVar12 & auVar21;
    auVar9 = pshuflw(auVar17,auVar12,0xe8);
    auVar9 = packssdw(auVar9,auVar9);
    if ((auVar9 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      *(undefined1 *)((long)(this->data + -3) + lVar2) = 0;
    }
    auVar9 = packssdw(auVar12,auVar12);
    auVar9 = packssdw(auVar9,auVar9);
    if ((auVar9 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
      *(undefined1 *)((long)(this->data + -2) + lVar2) = 0;
    }
    auVar9 = auVar3 ^ auVar1;
    iVar8 = auVar9._0_4_;
    iVar14 = auVar9._8_4_;
    auVar18._4_4_ = iVar8;
    auVar18._0_4_ = iVar8;
    auVar18._8_4_ = iVar14;
    auVar18._12_4_ = iVar14;
    auVar22._0_4_ = -(uint)(iVar8 < -0x7fffffea);
    auVar22._4_4_ = -(uint)(iVar8 < -0x7fffffea);
    auVar22._8_4_ = -(uint)(iVar14 < -0x7fffffea);
    auVar22._12_4_ = -(uint)(iVar14 < -0x7fffffea);
    auVar13._0_4_ = -(uint)(auVar9._4_4_ == -0x80000000);
    auVar13._4_4_ = -(uint)(auVar9._4_4_ == -0x80000000);
    auVar13._8_4_ = -(uint)(auVar9._12_4_ == -0x80000000);
    auVar13._12_4_ = -(uint)(auVar9._12_4_ == -0x80000000);
    auVar13 = auVar13 & auVar22;
    auVar9 = packssdw(auVar18,auVar13);
    auVar9 = packssdw(auVar9,auVar9);
    if ((auVar9 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      *(undefined1 *)((long)(this->data + -1) + lVar2) = 0;
    }
    auVar9 = pshufhw(auVar13,auVar13,0x84);
    auVar9 = packssdw(auVar9,auVar9);
    if ((auVar9 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      *(undefined1 *)((long)&this->data[0].name + lVar2) = 0;
    }
    lVar4 = auVar7._8_8_;
    auVar7._0_8_ = auVar7._0_8_ + 8;
    auVar7._8_8_ = lVar4 + 8;
    lVar4 = auVar6._8_8_;
    auVar6._0_8_ = auVar6._0_8_ + 8;
    auVar6._8_8_ = lVar4 + 8;
    lVar4 = auVar5._8_8_;
    auVar5._0_8_ = auVar5._0_8_ + 8;
    auVar5._8_8_ = lVar4 + 8;
    lVar4 = auVar3._8_8_;
    auVar3._0_8_ = auVar3._0_8_ + 8;
    auVar3._8_8_ = lVar4 + 8;
    lVar2 = lVar2 + 0x80;
  } while (lVar2 != 0x1fd);
  return;
}

Assistant:

void GGWave::Protocols::disableAll() {
    for (int i = 0; i < GGWAVE_PROTOCOL_COUNT; i++) {
        auto & p = this->data[i];
        p.enabled = false;
    }
}